

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::AllocStackClosure(Lowerer *this)

{
  Func *pFVar1;
  StackSym *pSVar2;
  Lowerer *this_local;
  
  pFVar1 = this->m_func;
  pSVar2 = Func::GetLocalFrameDisplaySym(this->m_func);
  Func::StackAllocate(pFVar1,pSVar2,8);
  pFVar1 = this->m_func;
  pSVar2 = Func::GetLocalClosureSym(this->m_func);
  Func::StackAllocate(pFVar1,pSVar2,8);
  return;
}

Assistant:

void
Lowerer::AllocStackClosure()
{
    m_func->StackAllocate(m_func->GetLocalFrameDisplaySym(), sizeof(Js::Var));
    m_func->StackAllocate(m_func->GetLocalClosureSym(), sizeof(Js::Var));
}